

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refresh.c
# Opt level: O3

void re_clear_lines(EditLine *el)

{
  wchar_t i;
  wchar_t where;
  bool bVar1;
  
  where = (el->el_refresh).r_oldcv;
  if (((el->el_terminal).t_flags & L'\x04') == L'\0') {
    terminal_move_to_line(el,where);
    terminal__putc(el,0xd);
    terminal__putc(el,10);
    return;
  }
  if (L'\xffffffff' < where) {
    do {
      terminal_move_to_line(el,where);
      terminal_move_to_char(el,L'\0');
      terminal_clear_EOL(el,(el->el_terminal).t_size.h);
      bVar1 = where != L'\0';
      where = where + L'\xffffffff';
    } while (bVar1);
  }
  return;
}

Assistant:

libedit_private void
re_clear_lines(EditLine *el)
{

	if (EL_CAN_CEOL) {
		int i;
		for (i = el->el_refresh.r_oldcv; i >= 0; i--) {
			/* for each line on the screen */
			terminal_move_to_line(el, i);
			terminal_move_to_char(el, 0);
			terminal_clear_EOL(el, el->el_terminal.t_size.h);
		}
	} else {
		terminal_move_to_line(el, el->el_refresh.r_oldcv);
					/* go to last line */
		terminal__putc(el, '\r');	/* go to BOL */
		terminal__putc(el, '\n');	/* go to new line */
	}
}